

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O1

void __thiscall
Rml::DataParser::Function(DataParser *this,Instruction instruction,int num_arguments,String *name)

{
  code *pcVar1;
  bool bVar2;
  undefined1 local_58 [48];
  
  if ((instruction != EventFnc) && (instruction != TransformFnc)) {
    bVar2 = Assert("RMLUI_ASSERT(instruction == Instruction::TransformFnc || instruction == Instruction::EventFnc)"
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataExpression.cpp"
                   ,0xf4);
    if (!bVar2) goto LAB_001f5f5d;
  }
  if (num_arguments < 0) {
    bVar2 = Assert("RMLUI_ASSERT(num_arguments >= 0)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataExpression.cpp"
                   ,0xf5);
    if (!bVar2) {
LAB_001f5f5d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  if (this->program_stack_size < num_arguments) {
    CreateString_abi_cxx11_
              ((String *)local_58,
               "Internal parser error: Popping %d arguments, but the stack contains only %d elements."
               ,(ulong)(uint)num_arguments);
    Error(this,(String *)local_58);
    if ((undefined1 *)CONCAT44(local_58._4_4_,local_58._0_4_) != local_58 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_58._4_4_,local_58._0_4_),local_58._16_8_ + 1);
    }
  }
  else {
    this->program_stack_size = this->program_stack_size - num_arguments;
    local_58._0_4_ = NumArguments;
    local_58._8_8_ = NONE;
    Variant::Set((Variant *)(local_58 + 8),num_arguments);
    ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::
    emplace_back<Rml::InstructionData>(&this->program,(InstructionData *)local_58);
    Variant::~Variant((Variant *)(local_58 + 8));
    local_58._8_8_ = NONE;
    local_58._0_4_ = instruction;
    Variant::Set((Variant *)(local_58 + 8),name);
    ::std::vector<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>::
    emplace_back<Rml::InstructionData>(&this->program,(InstructionData *)local_58);
    Variant::~Variant((Variant *)(local_58 + 8));
  }
  return;
}

Assistant:

void Function(Instruction instruction, int num_arguments, String&& name)
	{
		RMLUI_ASSERT(instruction == Instruction::TransformFnc || instruction == Instruction::EventFnc);
		RMLUI_ASSERT(num_arguments >= 0);
		if (program_stack_size < num_arguments)
		{
			Error(CreateString("Internal parser error: Popping %d arguments, but the stack contains only %d elements.", num_arguments,
				program_stack_size));
			return;
		}
		program_stack_size -= num_arguments;
		program.push_back(InstructionData{Instruction::NumArguments, Variant(int(num_arguments))});
		program.push_back(InstructionData{instruction, Variant(std::move(name))});
	}